

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMD.cpp
# Opt level: O1

void __thiscall OpenMD::RNEMD::RNEMD::collectData(RNEMD *this)

{
  undefined8 *puVar1;
  int *piVar2;
  pointer pdVar3;
  Snapshot *pSVar4;
  pointer piVar5;
  undefined1 auVar6 [16];
  double dVar7;
  RealType RVar8;
  undefined8 uVar9;
  uint i;
  uint uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  Molecule *pMVar14;
  pointer ppSVar15;
  double *pdVar16;
  Vector3d *pVVar17;
  __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
  _Var18;
  ConstraintPair *pCVar19;
  undefined1 *puVar20;
  uint i_4;
  undefined4 uVar21;
  ulong uVar22;
  RealType *pRVar23;
  Vector3d *pVVar24;
  double (*padVar25) [3];
  uint j;
  long lVar26;
  double (*padVar27) [3];
  _func_int **pp_Var28;
  uint j_1;
  long lVar29;
  Mat3x3d *pMVar30;
  uint j_2;
  ulong uVar31;
  _func_int *p_Var32;
  pointer ppCVar33;
  RigidBody *rb;
  StuntDouble *pSVar34;
  byte bVar35;
  double tmp;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar38;
  undefined1 auVar39 [16];
  Vector3d omega;
  Mat3x3d Ia;
  Vector<double,_3U> result_4;
  Vector3d eField;
  AtomType *atype;
  MoleculeIterator miter;
  Vector3d vel;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  binTypeCounts;
  vector<int,_std::allocator<int>_> binEFieldCount;
  vector<double,_std::allocator<double>_> nden;
  Vector3d rPos;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> binEField;
  vector<int,_std::allocator<int>_> binCount;
  vector<int,_std::allocator<int>_> binDOF;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> binL;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> binP;
  vector<double,_std::allocator<double>_> binMass;
  vector<double,_std::allocator<double>_> binKE;
  vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_> binI;
  Mat3x3d I;
  shared_ptr<OpenMD::SPFData> spfData;
  Vector3d L;
  vector<double,_std::allocator<double>_> binOmega;
  Vector<double,_3U> result_3;
  RealType area;
  RectMatrix<double,_3U,_3U> result_2;
  Vector3d local_438;
  undefined1 local_418 [16];
  pointer local_400;
  Vector3d local_3f8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  double local_3b8;
  double local_3b0;
  undefined1 local_3a8 [16];
  pointer local_398 [4];
  undefined1 local_378 [16];
  double local_368;
  _func_int **local_358;
  MoleculeIterator local_350;
  double local_348 [4];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_328;
  vector<int,_std::allocator<int>_> local_310;
  vector<double,_std::allocator<double>_> local_2f8;
  double local_2d8 [3];
  Mat3x3d *local_2c0;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_2b8;
  vector<int,_std::allocator<int>_> local_2a0;
  vector<int,_std::allocator<int>_> local_288;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_270;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_258;
  vector<double,_std::allocator<double>_> local_240;
  undefined1 local_228 [16];
  vector<double,_std::allocator<double>_> local_218;
  vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_> local_200;
  Mat3x3d local_1e8;
  Molecule *local_1a0;
  long local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_190;
  Vector3d local_188;
  Vector3d local_168;
  Vector3d local_148;
  double local_128 [4];
  double local_108 [3];
  vector<double,_std::allocator<double>_> local_f0;
  double local_d8 [4];
  Vector3d local_b8;
  Vector3d local_98;
  RealType local_80 [10];
  
  bVar35 = 0;
  if (this->doRNEMD_ == true) {
    pSVar4 = this->info_->sman_->currentSnapshot_;
    this->currentSnap_ = pSVar4;
    Snapshot::getHmat(&local_1e8,pSVar4);
    pMVar30 = &this->hmat_;
    if (pMVar30 != &local_1e8) {
      lVar13 = 0;
      do {
        *(undefined8 *)
         ((long)(this->hmat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                [0] + lVar13 + 0x10) =
             *(undefined8 *)
              ((long)local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                     [0] + lVar13 + 0x10);
        uVar9 = *(undefined8 *)
                 ((long)local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0] + lVar13 + 8);
        puVar1 = (undefined8 *)
                 ((long)(pMVar30->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                        data_[0] + lVar13);
        *puVar1 = *(undefined8 *)
                   ((long)local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0] + lVar13);
        puVar1[1] = uVar9;
        lVar13 = lVar13 + 0x18;
      } while (lVar13 != 0x48);
    }
    local_80[0] = getDefaultDividingArea(this);
    Utils::Accumulator<double>::add(&this->areaAccumulator_,local_80);
    local_108[2] = (this->angularMomentumFluxVector_).super_Vector<double,_3U>.data_[2];
    local_108[0] = (this->angularMomentumFluxVector_).super_Vector<double,_3U>.data_[0];
    local_108[1] = (this->angularMomentumFluxVector_).super_Vector<double,_3U>.data_[1];
    dVar38 = 0.0;
    lVar13 = 0;
    do {
      dVar38 = dVar38 + local_108[lVar13] * local_108[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    if (dVar38 < 0.0) {
      dVar38 = sqrt(dVar38);
    }
    else {
      dVar38 = SQRT(dVar38);
    }
    lVar13 = 0;
    do {
      local_108[lVar13] = local_108[lVar13] / dVar38;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    if ((this->outputEvaluator_).isDynamic_ == true) {
      SelectionEvaluator::evaluate((SelectionSet *)&local_1e8,&this->outputEvaluator_);
      lVar13 = 0;
      do {
        std::vector<bool,_std::allocator<bool>_>::operator=
                  ((vector<bool,_std::allocator<bool>_> *)
                   ((long)&(((this->outputSeleMan_).ss_.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar13)
                   ,(vector<bool,_std::allocator<bool>_> *)
                    ((long)local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                           data_[0][0] + lVar13));
        lVar13 = lVar13 + 0x28;
      } while (lVar13 != 0xf0);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_1e8);
    }
    local_348[0] = 0.0;
    local_348[1] = 0.0;
    local_348[2] = 0.0;
    local_2d8[2] = 0.0;
    local_2d8[0] = 0.0;
    local_2d8[1] = 0.0;
    local_128[2] = 0.0;
    local_128[0] = 0.0;
    local_128[1] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
    local_368 = 0.0;
    local_378 = ZEXT816(0);
    local_3f8.super_Vector<double,_3U>.data_[0] = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_240,(ulong)this->nBins_,(value_type_conflict1 *)&local_3f8,
               (allocator_type *)&local_258);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              (&local_258,(ulong)this->nBins_,(value_type *)OpenMD::V3Zero,
               (allocator_type *)&local_3f8);
    local_3f8.super_Vector<double,_3U>.data_[0] = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_f0,(ulong)this->nBins_,(value_type_conflict1 *)&local_3f8,
               (allocator_type *)&local_270);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              (&local_270,(ulong)this->nBins_,(value_type *)OpenMD::V3Zero,
               (allocator_type *)&local_3f8);
    std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
    vector(&local_200,(ulong)this->nBins_,(allocator_type *)&local_3f8);
    local_3f8.super_Vector<double,_3U>.data_[0] = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_218,(ulong)this->nBins_,(value_type_conflict1 *)&local_3f8,
               (allocator_type *)&local_2b8);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              (&local_2b8,(ulong)this->nBins_,(value_type *)OpenMD::V3Zero,
               (allocator_type *)&local_3f8);
    local_3f8.super_Vector<double,_3U>.data_[0] =
         (double)((ulong)local_3f8.super_Vector<double,_3U>.data_[0] & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_288,(ulong)this->nBins_,(value_type_conflict2 *)&local_3f8,
               (allocator_type *)&local_2a0);
    local_3f8.super_Vector<double,_3U>.data_[0] =
         (double)((ulong)local_3f8.super_Vector<double,_3U>.data_[0] & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_2a0,(ulong)this->nBins_,(value_type_conflict2 *)&local_3f8,
               (allocator_type *)&local_310);
    local_3f8.super_Vector<double,_3U>.data_[0] =
         (double)((ulong)local_3f8.super_Vector<double,_3U>.data_[0] & 0xffffffff00000000);
    local_2c0 = pMVar30;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_310,(ulong)this->nBins_,(value_type_conflict2 *)&local_3f8,
               (allocator_type *)&local_328);
    local_328.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_328.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_328.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (((this->outputMask_).super__Base_bitset<1UL>._M_w & 0x40) != 0) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::resize(&local_328,(ulong)this->nBins_);
      if (this->nBins_ != 0) {
        lVar13 = 0;
        uVar31 = 0;
        do {
          local_3f8.super_Vector<double,_3U>.data_[0] =
               (double)((ulong)local_3f8.super_Vector<double,_3U>.data_[0] & 0xffffffff00000000);
          std::vector<int,_std::allocator<int>_>::resize
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)&((local_328.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar13),
                     (long)(this->outputTypes_).
                           super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->outputTypes_).
                           super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3,
                     (value_type_conflict2 *)&local_3f8);
          uVar31 = uVar31 + 1;
          lVar13 = lVar13 + 0x18;
        } while (uVar31 < this->nBins_);
      }
    }
    local_350._M_node = (_Base_ptr)0x0;
    Snapshot::getSPFData(this->currentSnap_);
    pMVar14 = SimInfo::beginMolecule(this->info_,&local_350);
    local_228._0_8_ = 0x800000000000003f;
    while (pMVar14 != (Molecule *)0x0) {
      if (pMVar14->globalIndex_ != *(int *)(local_198 + 0x20)) {
        ppSVar15 = (pMVar14->integrableObjects_).
                   super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if (ppSVar15 ==
            (pMVar14->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar34 = (StuntDouble *)0x0;
        }
        else {
          pSVar34 = *ppSVar15;
        }
        if (pSVar34 != (StuntDouble *)0x0) {
          local_1a0 = pMVar14;
          do {
            pVVar24 = &local_3f8;
            local_400 = ppSVar15;
            uVar22 = (ulong)pSVar34->globalIndex_;
            uVar31 = uVar22 + 0x3f;
            if (-1 < (long)uVar22) {
              uVar31 = uVar22;
            }
            if ((*(ulong *)(((long)uVar31 >> 6) * 8 +
                            *(long *)&(((this->outputSeleMan_).ss_.bitsets_.
                                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                                      super__Bvector_base<std::allocator<bool>_> + -8 +
                           (ulong)((uVar22 & local_228._0_8_) < 0x8000000000000001) * 8) >>
                 (uVar22 & 0x3f) & 1) != 0) {
              lVar13 = *(long *)((long)&(pSVar34->snapshotMan_->currentSnapshot_->atomData).position
                                        .
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar34->storage_);
              pdVar16 = (double *)(lVar13 + (long)pSVar34->localIndex_ * 0x18);
              local_98.super_Vector<double,_3U>.data_[0] = *pdVar16;
              local_98.super_Vector<double,_3U>.data_[1] = pdVar16[1];
              local_98.super_Vector<double,_3U>.data_[2] =
                   *(double *)(lVar13 + 0x10 + (long)pSVar34->localIndex_ * 0x18);
              uVar10 = getBin(this,&local_98);
              dVar38 = pSVar34->mass_;
              local_418._0_8_ = dVar38;
              pSVar4 = pSVar34->snapshotMan_->currentSnapshot_;
              lVar13 = *(long *)((long)&(pSVar4->atomData).velocity.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar34->storage_);
              lVar26 = (long)pSVar34->localIndex_ * 0x18;
              pdVar16 = (double *)(lVar13 + lVar26);
              local_348[2] = *(double *)(lVar13 + 0x10 + lVar26);
              local_348[0] = *pdVar16;
              local_348[1] = pdVar16[1];
              lVar13 = *(long *)((long)&(pSVar4->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar34->storage_);
              local_438.super_Vector<double,_3U>.data_[2] = *(double *)(lVar13 + 0x10 + lVar26);
              pdVar16 = (double *)(lVar13 + lVar26);
              local_438.super_Vector<double,_3U>.data_[0] = *pdVar16;
              local_438.super_Vector<double,_3U>.data_[1] = pdVar16[1];
              local_3f8.super_Vector<double,_3U>.data_[0] = 0.0;
              local_3f8.super_Vector<double,_3U>.data_[1] = 0.0;
              local_3f8.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar13 = 0;
              do {
                local_3f8.super_Vector<double,_3U>.data_[lVar13] =
                     local_438.super_Vector<double,_3U>.data_[lVar13] -
                     (this->coordinateOrigin_).super_Vector<double,_3U>.data_[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_2d8[2] = local_3f8.super_Vector<double,_3U>.data_[2];
              local_2d8[0] = local_3f8.super_Vector<double,_3U>.data_[0];
              local_2d8[1] = local_3f8.super_Vector<double,_3U>.data_[1];
              dVar7 = 0.0;
              lVar13 = 0;
              do {
                dVar7 = dVar7 + local_348[lVar13] * local_348[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_3a8._0_8_ = dVar38 * 0.5 * dVar7;
              uVar21 = 3;
              if (pSVar34->objType_ - otDAtom < 2) {
                lVar13 = *(long *)((long)&(pSVar34->snapshotMan_->currentSnapshot_->atomData).
                                          angularMomentum.
                                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  pSVar34->storage_);
                local_438.super_Vector<double,_3U>.data_[2] =
                     *(double *)(lVar13 + 0x10 + (long)pSVar34->localIndex_ * 0x18);
                pdVar16 = (double *)(lVar13 + (long)pSVar34->localIndex_ * 0x18);
                local_438.super_Vector<double,_3U>.data_[0] = *pdVar16;
                local_438.super_Vector<double,_3U>.data_[1] = pdVar16[1];
                (*pSVar34->_vptr_StuntDouble[5])(pVVar24);
                if (pSVar34->linear_ == true) {
                  iVar12 = pSVar34->linearAxis_;
                  uVar22 = (ulong)(((iVar12 + 1) / 3) * -3 + iVar12 + 1);
                  uVar31 = (ulong)(iVar12 + ((iVar12 + 2) / 3) * -3 + 2);
                  dVar38 = local_438.super_Vector<double,_3U>.data_[uVar22];
                  dVar38 = (dVar38 * dVar38) / *(double *)((long)&local_3f8 + uVar22 * 0x20);
                  local_438.super_Vector<double,_3U>.data_[2] =
                       local_438.super_Vector<double,_3U>.data_[uVar31];
                  local_438.super_Vector<double,_3U>.data_[2] =
                       local_438.super_Vector<double,_3U>.data_[2] *
                       local_438.super_Vector<double,_3U>.data_[2];
                  pdVar16 = (double *)((long)&local_3f8 + uVar31 * 0x20);
                  uVar21 = 5;
                }
                else {
                  auVar36._0_8_ =
                       local_438.super_Vector<double,_3U>.data_[0] *
                       local_438.super_Vector<double,_3U>.data_[0];
                  auVar36._8_8_ =
                       local_438.super_Vector<double,_3U>.data_[1] *
                       local_438.super_Vector<double,_3U>.data_[1];
                  auVar37._8_4_ = (int)local_3d8;
                  auVar37._0_8_ = local_3f8.super_Vector<double,_3U>.data_[0];
                  auVar37._12_4_ = (int)((ulong)local_3d8 >> 0x20);
                  auVar37 = divpd(auVar36,auVar37);
                  dVar38 = auVar37._8_8_ + auVar37._0_8_;
                  local_438.super_Vector<double,_3U>.data_[2] =
                       local_438.super_Vector<double,_3U>.data_[2] *
                       local_438.super_Vector<double,_3U>.data_[2];
                  uVar21 = 6;
                  pdVar16 = &local_3b8;
                }
                local_3a8._0_8_ =
                     (double)local_3a8._0_8_ +
                     (local_438.super_Vector<double,_3U>.data_[2] / *pdVar16 + dVar38) * 0.5;
              }
              local_3b0 = (double)CONCAT44(local_3b0._4_4_,uVar21);
              local_438.super_Vector<double,_3U>.data_[0] =
                   local_348[2] * local_2d8[1] - local_2d8[2] * local_348[1];
              local_438.super_Vector<double,_3U>.data_[1] =
                   local_348[0] * local_2d8[2] - local_2d8[0] * local_348[2];
              local_438.super_Vector<double,_3U>.data_[2] =
                   local_2d8[0] * local_348[1] - local_348[0] * local_2d8[1];
              local_3f8.super_Vector<double,_3U>.data_[0] = 0.0;
              local_3f8.super_Vector<double,_3U>.data_[1] = 0.0;
              local_3f8.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar13 = 0;
              do {
                local_3f8.super_Vector<double,_3U>.data_[lVar13] =
                     local_438.super_Vector<double,_3U>.data_[lVar13] * (double)local_418._0_8_;
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_128[2] = local_3f8.super_Vector<double,_3U>.data_[2];
              local_128[0] = local_3f8.super_Vector<double,_3U>.data_[0];
              local_128[1] = local_3f8.super_Vector<double,_3U>.data_[1];
              local_3c8 = 0;
              uStack_3c0 = 0;
              local_3d8 = 0;
              uStack_3d0 = 0;
              local_3f8.super_Vector<double,_3U>.data_[2] = 0.0;
              uStack_3e0 = 0;
              local_3f8.super_Vector<double,_3U>.data_[0] = 0.0;
              local_3f8.super_Vector<double,_3U>.data_[1] = 0.0;
              local_3b8 = 0.0;
              lVar13 = 0;
              pVVar17 = pVVar24;
              do {
                dVar38 = local_2d8[lVar13];
                lVar26 = 0;
                do {
                  (pVVar17->super_Vector<double,_3U>).data_[lVar26] = local_2d8[lVar26] * dVar38;
                  lVar26 = lVar26 + 1;
                } while (lVar26 != 3);
                lVar13 = lVar13 + 1;
                pVVar17 = pVVar17 + 1;
              } while (lVar13 != 3);
              local_80[7] = 0.0;
              local_80[8] = 0.0;
              local_80[5] = 0.0;
              local_80[6] = 0.0;
              local_80[3] = 0.0;
              local_80[4] = 0.0;
              local_80[1] = 0.0;
              local_80[2] = 0.0;
              local_80[9] = 0.0;
              pRVar23 = local_80 + 1;
              lVar13 = 0;
              do {
                lVar26 = 0;
                do {
                  pRVar23[lVar26] =
                       (pVVar24->super_Vector<double,_3U>).data_[lVar26] * (double)local_418._0_8_;
                  lVar26 = lVar26 + 1;
                } while (lVar26 != 3);
                lVar13 = lVar13 + 1;
                pRVar23 = pRVar23 + 3;
                pVVar24 = pVVar24 + 1;
              } while (lVar13 != 3);
              pRVar23 = local_80 + 1;
              pMVar30 = &local_1e8;
              for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pMVar30->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                [0] = *pRVar23;
                pRVar23 = pRVar23 + (ulong)bVar35 * -2 + 1;
                pMVar30 = (Mat3x3d *)((long)pMVar30 + ((ulong)bVar35 * -2 + 1) * 8);
              }
              dVar38 = 0.0;
              lVar13 = 0;
              do {
                dVar38 = dVar38 + local_2d8[lVar13] * local_2d8[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              dVar38 = dVar38 * (double)local_418._0_8_;
              local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
                   local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                   [0] + dVar38;
              local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
                   local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1]
                   [1] + dVar38;
              local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
                   dVar38 + local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                            .data_[2][2];
              if (((this->outputMask_).super__Base_bitset<1UL>._M_w & 0x40) != 0) {
                if (pSVar34->objType_ == otRigidBody) {
                  pp_Var28 = (_func_int **)pSVar34[2].mass_;
                  while( true ) {
                    if (pp_Var28 == pSVar34[2].properties_._vptr_PropertyMap) {
                      p_Var32 = (_func_int *)0x0;
                    }
                    else {
                      p_Var32 = *pp_Var28;
                    }
                    if (p_Var32 == (_func_int *)0x0) break;
                    pVVar24 = (Vector3d *)
                              ((long)*(int *)(p_Var32 + 0x30) * 0x18 +
                              *(long *)(*(long *)(*(long *)(p_Var32 + 0x18) + 0x18) +
                                       *(long *)(p_Var32 + 0x10)));
                    local_148.super_Vector<double,_3U>.data_[0] = 0.0;
                    local_148.super_Vector<double,_3U>.data_[1] = 0.0;
                    local_148.super_Vector<double,_3U>.data_[2] = 0.0;
                    if (pVVar24 != &local_148) {
                      lVar13 = 0;
                      do {
                        local_148.super_Vector<double,_3U>.data_[lVar13] =
                             (pVVar24->super_Vector<double,_3U>).data_[lVar13];
                        lVar13 = lVar13 + 1;
                      } while (lVar13 != 3);
                    }
                    uVar11 = getBin(this,&local_148);
                    local_358 = *(_func_int ***)(p_Var32 + 0x78);
                    _Var18 = std::
                             __find_if<__gnu_cxx::__normal_iterator<OpenMD::AtomType**,std::vector<OpenMD::AtomType*,std::allocator<OpenMD::AtomType*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::AtomType*const>>
                                       ((this->outputTypes_).
                                        super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (this->outputTypes_).
                                        super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish,&local_358);
                    iVar12 = (int)((ulong)((long)_Var18._M_current -
                                          (long)(this->outputTypes_).
                                                super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
                    if (_Var18._M_current ==
                        (this->outputTypes_).
                        super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
                      iVar12 = -1;
                    }
                    if (((-1 < (int)uVar11) && (iVar12 != -1)) && ((int)uVar11 < (int)this->nBins_))
                    {
                      piVar2 = local_328.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar11].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + iVar12;
                      *piVar2 = *piVar2 + 1;
                    }
                    pp_Var28 = pp_Var28 + 1;
                  }
                }
                else if (pSVar34->objType_ < otRigidBody) {
                  local_358 = pSVar34[1]._vptr_StuntDouble;
                  _Var18 = std::
                           __find_if<__gnu_cxx::__normal_iterator<OpenMD::AtomType**,std::vector<OpenMD::AtomType*,std::allocator<OpenMD::AtomType*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::AtomType*const>>
                                     ((this->outputTypes_).
                                      super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (this->outputTypes_).
                                      super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,&local_358);
                  iVar12 = (int)((ulong)((long)_Var18._M_current -
                                        (long)(this->outputTypes_).
                                              super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
                  if (_Var18._M_current ==
                      (this->outputTypes_).
                      super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    iVar12 = -1;
                  }
                  if ((((-1 < (int)uVar10) && ((int)uVar10 < (int)this->nBins_)) && (iVar12 != -1))
                     && (((this->outputMask_).super__Base_bitset<1UL>._M_w & 0x40) != 0)) {
                    piVar2 = local_328.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar10].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + iVar12;
                    *piVar2 = *piVar2 + 1;
                  }
                }
              }
              pMVar14 = local_1a0;
              if ((-1 < (int)uVar10) && ((int)uVar10 < (int)this->nBins_)) {
                local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10] =
                     local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10] + 1;
                local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10] =
                     local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10] + (double)local_418._0_8_;
                local_3f8.super_Vector<double,_3U>.data_[0] = 0.0;
                local_3f8.super_Vector<double,_3U>.data_[1] = 0.0;
                local_3f8.super_Vector<double,_3U>.data_[2] = 0.0;
                lVar13 = 0;
                do {
                  local_3f8.super_Vector<double,_3U>.data_[lVar13] =
                       local_348[lVar13] * (double)local_418._0_8_;
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 3);
                lVar13 = 0;
                do {
                  local_258.
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar10].super_Vector<double,_3U>.data_
                  [lVar13] = local_3f8.super_Vector<double,_3U>.data_[lVar13] +
                             local_258.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar10].
                             super_Vector<double,_3U>.data_[lVar13];
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 3);
                local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10] =
                     (double)local_3a8._0_8_ +
                     local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10];
                padVar27 = (double (*) [3])
                           (local_200.
                            super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar10);
                padVar25 = (double (*) [3])&local_1e8;
                lVar13 = 0;
                do {
                  lVar26 = 0;
                  do {
                    (((SquareMatrix<double,_3> *)*padVar27)->super_RectMatrix<double,_3U,_3U>).data_
                    [0][lVar26] = (((SquareMatrix<double,_3> *)*padVar25)->
                                  super_RectMatrix<double,_3U,_3U>).data_[0][lVar26] +
                                  (((SquareMatrix<double,_3> *)*padVar27)->
                                  super_RectMatrix<double,_3U,_3U>).data_[0][lVar26];
                    lVar26 = lVar26 + 1;
                  } while (lVar26 != 3);
                  lVar13 = lVar13 + 1;
                  padVar27 = padVar27 + 1;
                  padVar25 = padVar25 + 1;
                } while (lVar13 != 3);
                lVar13 = 0;
                do {
                  local_270.
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar10].super_Vector<double,_3U>.data_
                  [lVar13] = local_128[lVar13] +
                             local_270.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar10].
                             super_Vector<double,_3U>.data_[lVar13];
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 3);
                local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10] =
                     local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10] + local_3b0._0_4_;
              }
            }
            if (((this->outputMask_).super__Base_bitset<1UL>._M_w & 0x80) != 0) {
              if (pSVar34->objType_ == otRigidBody) {
                pp_Var28 = (_func_int **)pSVar34[2].mass_;
                while( true ) {
                  if (pp_Var28 == pSVar34[2].properties_._vptr_PropertyMap) {
                    p_Var32 = (_func_int *)0x0;
                  }
                  else {
                    p_Var32 = *pp_Var28;
                  }
                  if (p_Var32 == (_func_int *)0x0) break;
                  pVVar24 = (Vector3d *)
                            ((long)*(int *)(p_Var32 + 0x30) * 0x18 +
                            *(long *)(*(long *)(*(long *)(p_Var32 + 0x18) + 0x18) +
                                     *(long *)(p_Var32 + 0x10)));
                  local_168.super_Vector<double,_3U>.data_[0] = 0.0;
                  local_168.super_Vector<double,_3U>.data_[1] = 0.0;
                  local_168.super_Vector<double,_3U>.data_[2] = 0.0;
                  if (pVVar24 != &local_168) {
                    lVar13 = 0;
                    do {
                      local_168.super_Vector<double,_3U>.data_[lVar13] =
                           (pVVar24->super_Vector<double,_3U>).data_[lVar13];
                      lVar13 = lVar13 + 1;
                    } while (lVar13 != 3);
                  }
                  uVar10 = getBin(this,&local_168);
                  lVar13 = *(long *)(*(long *)(*(long *)(p_Var32 + 0x18) + 0x18) + 0x120 +
                                    *(long *)(p_Var32 + 0x10));
                  local_368 = *(double *)(lVar13 + 0x10 + (long)*(int *)(p_Var32 + 0x30) * 0x18);
                  local_378 = *(undefined1 (*) [16])(lVar13 + (long)*(int *)(p_Var32 + 0x30) * 0x18)
                  ;
                  if ((-1 < (int)uVar10) && ((int)uVar10 < (int)this->nBins_)) {
                    local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar10] =
                         local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar10] + 1;
                    lVar13 = 0;
                    do {
                      local_2b8.
                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar10].super_Vector<double,_3U>.
                      data_[lVar13] =
                           *(double *)(local_378 + lVar13 * 8) +
                           local_2b8.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar10].
                           super_Vector<double,_3U>.data_[lVar13];
                      lVar13 = lVar13 + 1;
                    } while (lVar13 != 3);
                  }
                  pp_Var28 = pp_Var28 + 1;
                }
              }
              else {
                pSVar4 = pSVar34->snapshotMan_->currentSnapshot_;
                lVar13 = *(long *)((long)&(pSVar4->atomData).electricField.
                                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  pSVar34->storage_);
                lVar26 = (long)pSVar34->localIndex_ * 0x18;
                local_378 = *(undefined1 (*) [16])(lVar13 + lVar26);
                local_368 = *(double *)(lVar13 + 0x10 + lVar26);
                pVVar24 = (Vector3d *)
                          (lVar26 + *(long *)((long)&(pSVar4->atomData).position.
                                                                                                          
                                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                             pSVar34->storage_));
                local_188.super_Vector<double,_3U>.data_[0] = 0.0;
                local_188.super_Vector<double,_3U>.data_[1] = 0.0;
                local_188.super_Vector<double,_3U>.data_[2] = 0.0;
                if (pVVar24 != &local_188) {
                  lVar13 = 0;
                  do {
                    local_188.super_Vector<double,_3U>.data_[lVar13] =
                         (pVVar24->super_Vector<double,_3U>).data_[lVar13];
                    lVar13 = lVar13 + 1;
                  } while (lVar13 != 3);
                }
                uVar10 = getBin(this,&local_188);
                if ((-1 < (int)uVar10) && ((int)uVar10 < (int)this->nBins_)) {
                  local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar10] =
                       local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar10] + 1;
                  lVar13 = 0;
                  do {
                    local_2b8.
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar10].super_Vector<double,_3U>.data_
                    [lVar13] = *(double *)(local_378 + lVar13 * 8) +
                               local_2b8.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar10].
                               super_Vector<double,_3U>.data_[lVar13];
                    lVar13 = lVar13 + 1;
                  } while (lVar13 != 3);
                }
              }
            }
            ppSVar15 = local_400 + 1;
            if (ppSVar15 ==
                (pMVar14->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              pSVar34 = (StuntDouble *)0x0;
            }
            else {
              pSVar34 = *ppSVar15;
            }
          } while (pSVar34 != (StuntDouble *)0x0);
        }
        uVar22 = (ulong)pMVar14->globalIndex_;
        uVar31 = uVar22 + 0x3f;
        if (-1 < (long)uVar22) {
          uVar31 = uVar22;
        }
        if ((*(ulong *)(((long)uVar31 >> 6) * 8 +
                        *(long *)&(this->outputSeleMan_).ss_.bitsets_.
                                  super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                  ._M_impl.super__Vector_impl_data._M_start[5].bitset_.
                                  super__Bvector_base<std::allocator<bool>_> + -8 +
                       (ulong)((uVar22 & local_228._0_8_) < 0x8000000000000001) * 8) >>
             (uVar22 & 0x3f) & 1) != 0) {
          ppCVar33 = (pMVar14->constraintPairs_).
                     super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          while( true ) {
            if (ppCVar33 ==
                (pMVar14->constraintPairs_).
                super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              pCVar19 = (ConstraintPair *)0x0;
            }
            else {
              pCVar19 = *ppCVar33;
            }
            if (pCVar19 == (ConstraintPair *)0x0) break;
            pSVar34 = pCVar19->consElem1_->sd_;
            pVVar24 = (Vector3d *)
                      ((long)pSVar34->localIndex_ * 0x18 +
                      *(long *)((long)&(pSVar34->snapshotMan_->currentSnapshot_->atomData).position.
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + pSVar34->storage_
                               ));
            local_3f8.super_Vector<double,_3U>.data_[0] = 0.0;
            local_3f8.super_Vector<double,_3U>.data_[1] = 0.0;
            local_3f8.super_Vector<double,_3U>.data_[2] = 0.0;
            if (pVVar24 != &local_3f8) {
              lVar13 = 0;
              do {
                local_3f8.super_Vector<double,_3U>.data_[lVar13] =
                     (pVVar24->super_Vector<double,_3U>).data_[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
            }
            pSVar34 = pCVar19->consElem2_->sd_;
            puVar20 = (undefined1 *)
                      ((long)pSVar34->localIndex_ * 0x18 +
                      *(long *)((long)&(pSVar34->snapshotMan_->currentSnapshot_->atomData).position.
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + pSVar34->storage_
                               ));
            local_438.super_Vector<double,_3U>.data_[0] = 0.0;
            local_438.super_Vector<double,_3U>.data_[1] = 0.0;
            local_438.super_Vector<double,_3U>.data_[2] = 0.0;
            if ((Vector3d *)puVar20 != &local_438) {
              lVar13 = 0;
              do {
                local_438.super_Vector<double,_3U>.data_[lVar13] = *(double *)(puVar20 + lVar13 * 8)
                ;
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
            }
            if (this->usePeriodicBoundaryConditions_ == true) {
              Snapshot::wrapVector(this->currentSnap_,&local_3f8);
              Snapshot::wrapVector(this->currentSnap_,&local_438);
            }
            local_d8[0] = 0.0;
            local_d8[1] = 0.0;
            local_d8[2] = 0.0;
            lVar13 = 0;
            do {
              local_d8[lVar13] =
                   local_3f8.super_Vector<double,_3U>.data_[lVar13] +
                   local_438.super_Vector<double,_3U>.data_[lVar13];
              lVar13 = lVar13 + 1;
            } while (lVar13 != 3);
            local_398[0] = (pointer)0x0;
            local_398[1] = (pointer)0x0;
            local_398[2] = (pointer)0x0;
            lVar13 = 0;
            do {
              local_398[lVar13] = (pointer)(local_d8[lVar13] * 0.5);
              lVar13 = lVar13 + 1;
            } while (lVar13 != 3);
            local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = local_398[2];
            local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = local_398[0];
            local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = local_398[1];
            local_b8.super_Vector<double,_3U>.data_[0] = (double)local_398[0];
            local_b8.super_Vector<double,_3U>.data_[1] = (double)local_398[1];
            local_b8.super_Vector<double,_3U>.data_[2] = (double)local_398[2];
            iVar12 = getBin(this,&local_b8);
            local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar12] =
                 local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar12] + -1;
            ppCVar33 = ppCVar33 + 1;
          }
        }
      }
      pMVar14 = SimInfo::nextMolecule(this->info_,&local_350);
    }
    local_438.super_Vector<double,_3U>.data_[0] = 0.0;
    local_438.super_Vector<double,_3U>.data_[1] = 0.0;
    local_438.super_Vector<double,_3U>.data_[2] = 0.0;
    local_3f8.super_Vector<double,_3U>.data_[0] = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_2f8,
               (long)(this->outputTypes_).
                     super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->outputTypes_).
                     super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3,
               (value_type_conflict1 *)&local_3f8,(allocator_type *)local_398);
    RVar8 = Snapshot::getVolume(this->currentSnap_);
    local_228._8_4_ = extraout_XMM0_Dc;
    local_228._0_8_ = RVar8;
    local_228._12_4_ = extraout_XMM0_Dd;
    uVar31 = (ulong)this->nBins_;
    if (this->nBins_ != 0) {
      local_3b0 = 0.0;
      lVar13 = 0;
      uVar22 = 0;
      local_3a8 = ZEXT816(0);
      do {
        dVar38 = (double)(uVar22 & 0xffffffff) + 0.5;
        if (this->usePeriodicBoundaryConditions_ == true) {
          (**(code **)(**(long **)(*(long *)&(((this->data_).
                                               super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             accumulator).
                                             super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                             ._M_impl.super__Vector_impl_data + uVar22 * 8) + 0x10))
                    (SUB84((dVar38 / (double)uVar31) *
                           *(double *)
                            ((long)(local_2c0->super_SquareMatrix<double,_3>).
                                   super_RectMatrix<double,_3U,_3U>.data_ +
                            (ulong)this->rnemdPrivilegedAxis_ * 0x20),0));
          dVar38 = (double)this->nBins_;
          auVar39._8_8_ =
               *(undefined8 *)
                ((long)(local_2c0->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_ + (ulong)this->rnemdPrivilegedAxis_ * 0x20);
          auVar39._0_8_ = local_228._0_8_;
          auVar6._8_4_ = SUB84(dVar38,0);
          auVar6._0_8_ = dVar38;
          auVar6._12_4_ = (int)((ulong)dVar38 >> 0x20);
          local_418 = divpd(auVar39,auVar6);
        }
        else {
          local_400 = (pointer)(double)(uVar22 & 0xffffffff);
          (**(code **)(**(long **)(*(long *)&(this->data_).
                                             super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].
                                             accumulator.
                                             super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                             ._M_impl.super__Vector_impl_data + uVar22 * 8) + 0x10))
                    (SUB84(dVar38 * this->binWidth_,0));
          local_400 = (pointer)((double)local_400 * this->binWidth_);
          dVar38 = pow((double)((int)uVar22 + 1) * this->binWidth_,3.0);
          local_418._8_4_ = extraout_XMM0_Dc_00;
          local_418._0_8_ = dVar38;
          local_418._12_4_ = extraout_XMM0_Dd_00;
          dVar38 = pow((double)local_400,3.0);
          local_418._0_8_ = (((double)local_418._0_8_ - dVar38) * 12.566370614359172) / 3.0;
          local_418._8_8_ = local_3a8._0_8_;
        }
        if ((((this->outputMask_).super__Base_bitset<1UL>._M_w & 0x80) != 0) &&
           (iVar12 = local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar22], 0 < iVar12)) {
          local_3f8.super_Vector<double,_3U>.data_[0] = 0.0;
          local_3f8.super_Vector<double,_3U>.data_[1] = 0.0;
          local_3f8.super_Vector<double,_3U>.data_[2] = 0.0;
          lVar26 = 0;
          do {
            local_3f8.super_Vector<double,_3U>.data_[lVar26] =
                 *(double *)
                  ((long)((local_2b8.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).
                         data_ + lVar26 * 8 + lVar13) / (double)iVar12;
            lVar26 = lVar26 + 1;
          } while (lVar26 != 3);
          local_368 = local_3f8.super_Vector<double,_3U>.data_[2];
          local_378._8_4_ = local_3f8.super_Vector<double,_3U>.data_[1]._0_4_;
          local_378._0_8_ = local_3f8.super_Vector<double,_3U>.data_[0];
          local_378._12_4_ = local_3f8.super_Vector<double,_3U>.data_[1]._4_4_;
          (**(code **)(**(long **)(*(long *)&(this->data_).
                                             super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                             ._M_impl.super__Vector_impl_data._M_start[7].
                                             accumulator.
                                             super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                             ._M_impl.super__Vector_impl_data + uVar22 * 8) + 0x20))
                    ();
        }
        local_3a8._8_4_ = local_418._8_4_;
        local_3a8._0_8_ = local_418._8_8_;
        local_3a8._12_4_ = local_418._12_4_;
        if (((((this->outputMask_).super__Base_bitset<1UL>._M_w & 0x100) != 0) &&
            (this->usePeriodicBoundaryConditions_ == true)) &&
           (0 < local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar22])) {
          local_3b0 = local_3b0 +
                      *(double *)(local_378 + (ulong)this->rnemdPrivilegedAxis_ * 8) *
                      local_418._8_8_;
          (**(code **)(**(long **)(*(long *)&(this->data_).
                                             super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                             ._M_impl.super__Vector_impl_data._M_start[8].
                                             accumulator.
                                             super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                             ._M_impl.super__Vector_impl_data + uVar22 * 8) + 0x10))
                    ();
        }
        dVar38 = (double)local_418._0_8_;
        if (((this->outputMask_).super__Base_bitset<1UL>._M_w & 0x20) != 0) {
          (**(code **)(**(long **)(*(long *)&(this->data_).
                                             super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                             ._M_impl.super__Vector_impl_data._M_start[5].
                                             accumulator.
                                             super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                             ._M_impl.super__Vector_impl_data + uVar22 * 8) + 0x10))
                    (SUB84((local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar22] * 1.66053886) /
                           (double)local_418._0_8_,0));
          dVar38 = (double)local_418._0_8_;
        }
        if (((this->outputMask_).super__Base_bitset<1UL>._M_w & 0x40) != 0) {
          lVar26 = (long)(this->outputTypes_).
                         super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->outputTypes_).
                         super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if (lVar26 != 0) {
            piVar5 = local_328.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar22].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            uVar31 = 0;
            do {
              local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar31] =
                   ((double)piVar5[uVar31] / dVar38) * 1660.5390404272;
              uVar31 = uVar31 + 1;
            } while ((uVar31 & 0xffffffff) < (ulong)(lVar26 >> 3));
          }
          (**(code **)(**(long **)(*(long *)&(this->data_).
                                             super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                             ._M_impl.super__Vector_impl_data._M_start[6].
                                             accumulator.
                                             super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                             ._M_impl.super__Vector_impl_data + uVar22 * 8) + 0x18))
                    ();
        }
        if (0 < local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar22]) {
          if (((this->outputMask_).super__Base_bitset<1UL>._M_w & 8) != 0) {
            dVar38 = local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar22];
            local_3f8.super_Vector<double,_3U>.data_[0] = 0.0;
            local_3f8.super_Vector<double,_3U>.data_[1] = 0.0;
            local_3f8.super_Vector<double,_3U>.data_[2] = 0.0;
            lVar26 = 0;
            do {
              local_3f8.super_Vector<double,_3U>.data_[lVar26] =
                   *(double *)
                    ((long)((local_258.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).
                           data_ + lVar26 * 8 + lVar13) / dVar38;
              lVar26 = lVar26 + 1;
            } while (lVar26 != 3);
            local_348[2] = local_3f8.super_Vector<double,_3U>.data_[2];
            local_348[0] = local_3f8.super_Vector<double,_3U>.data_[0];
            local_348[1] = local_3f8.super_Vector<double,_3U>.data_[1];
            (**(code **)(**(long **)(*(long *)&(this->data_).
                                               super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                               ._M_impl.super__Vector_impl_data._M_start[3].
                                               accumulator.
                                               super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                               ._M_impl.super__Vector_impl_data + uVar22 * 8) + 0x20
                        ))();
          }
          if (((this->outputMask_).super__Base_bitset<1UL>._M_w & 0x10) != 0) {
            SquareMatrix3<double>::inverse
                      ((SquareMatrix3<double> *)&local_3f8,
                       local_200.
                       super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar22);
            local_398[0] = (pointer)0x0;
            local_398[1] = (pointer)0x0;
            local_398[2] = (pointer)0x0;
            lVar26 = 0;
            padVar25 = (double (*) [3])&local_3f8;
            do {
              pdVar3 = local_398[lVar26];
              lVar29 = 0;
              do {
                pdVar3 = (pointer)((double)pdVar3 +
                                  (((SquareMatrix<double,_3> *)*padVar25)->
                                  super_RectMatrix<double,_3U,_3U>).data_[0][lVar29] *
                                  *(double *)
                                   ((long)((local_270.
                                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super_Vector<double,_3U>).data_ + lVar29 * 8 + lVar13));
                lVar29 = lVar29 + 1;
              } while (lVar29 != 3);
              local_398[lVar26] = pdVar3;
              lVar26 = lVar26 + 1;
              padVar25 = padVar25 + 1;
            } while (lVar26 != 3);
            local_438.super_Vector<double,_3U>.data_[2] = (double)local_398[2];
            local_438.super_Vector<double,_3U>.data_[0] = (double)local_398[0];
            local_438.super_Vector<double,_3U>.data_[1] = (double)local_398[1];
            (**(code **)(**(long **)(*(long *)&(this->data_).
                                               super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                               ._M_impl.super__Vector_impl_data._M_start[4].
                                               accumulator.
                                               super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                               ._M_impl.super__Vector_impl_data + uVar22 * 8) + 0x20
                        ))();
          }
          if (((this->outputMask_).super__Base_bitset<1UL>._M_w & 4) != 0) {
            if (local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar22] < 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"No degrees of freedom in this bin?\n",0x23);
            }
            else {
              (**(code **)(**(long **)(*(long *)&(this->data_).
                                                 super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[2].
                                                 accumulator.
                                                 super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                                 ._M_impl.super__Vector_impl_data + uVar22 * 8) +
                          0x10))(SUB84((local_218.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start[uVar22] +
                                       local_218.super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar22]) /
                                       ((double)local_288.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start[uVar22] *
                                        0.0019872156 * 0.0004184),0));
            }
          }
        }
        uVar22 = uVar22 + 1;
        uVar31 = (ulong)this->nBins_;
        lVar13 = lVar13 + 0x18;
      } while (uVar22 < uVar31);
    }
    this->hasData_ = true;
    if (local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190);
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_328);
    if (local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_310.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2b8.
        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2b8.
                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_2b8.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2b8.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_218.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_200.
        super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_200.
                      super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_200.
                            super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_200.
                            super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_270.
        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_270.
                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_270.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_270.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_258.
        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_258.
                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_258.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_258.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void RNEMD::collectData() {
    if (!doRNEMD_) return;
    currentSnap_ = info_->getSnapshotManager()->getCurrentSnapshot();
    hmat_        = currentSnap_->getHmat();

    // collectData() can be called more frequently than the doRNEMD(), so use
    // the computed area from the last exchange time:
    RealType area = getDefaultDividingArea();
    areaAccumulator_.add(area);

    Vector3d u = angularMomentumFluxVector_;
    u.normalize();

    // throw an error if isDynamic instead?
    if (outputEvaluator_.isDynamic()) {
      outputSeleMan_.setSelectionSet(outputEvaluator_.evaluate());
    }

    int binNo {};
    int typeIndex(-1);
    RealType mass {};
    Vector3d vel {};
    Vector3d rPos {};
    RealType KE {};
    Vector3d L {};
    Mat3x3d I {};
    RealType r2 {};
    Vector3d eField {};
    int DOF {};

    vector<RealType> binMass(nBins_, 0.0);
    vector<Vector3d> binP(nBins_, V3Zero);
    vector<RealType> binOmega(nBins_, 0.0);
    vector<Vector3d> binL(nBins_, V3Zero);
    vector<Mat3x3d> binI(nBins_);
    vector<RealType> binKE(nBins_, 0.0);
    vector<Vector3d> binEField(nBins_, V3Zero);
    vector<int> binDOF(nBins_, 0);
    vector<int> binCount(nBins_, 0);
    vector<int> binEFieldCount(nBins_, 0);
    vector<vector<int>> binTypeCounts;

    if (outputMask_[ACTIVITY]) {
      binTypeCounts.resize(nBins_);
      for (unsigned int i = 0; i < nBins_; i++) {
        binTypeCounts[i].resize(outputTypes_.size(), 0);
      }
    }

    SimInfo::MoleculeIterator miter;
    std::vector<StuntDouble*>::iterator iiter;
    std::vector<AtomType*>::iterator at;
    Molecule* mol;
    StuntDouble* sd;
    AtomType* atype;
    ConstraintPair* consPair;
    Molecule::ConstraintPairIterator cpi;

    std::shared_ptr<SPFData> spfData = currentSnap_->getSPFData();

    for (mol = info_->beginMolecule(miter); mol != NULL;
         mol = info_->nextMolecule(miter)) {
      if (mol->getGlobalIndex() == spfData->globalID) { continue; }

      for (sd = mol->beginIntegrableObject(iiter); sd != NULL;
           sd = mol->nextIntegrableObject(iiter)) {
        if (outputSeleMan_.isSelected(sd)) {
          Vector3d pos = sd->getPos();
          binNo        = getBin(pos);

          mass = sd->getMass();
          vel  = sd->getVel();
          rPos = sd->getPos() - coordinateOrigin_;
          KE   = 0.5 * mass * vel.lengthSquare();
          DOF  = 3;

          if (sd->isDirectional()) {
            Vector3d angMom = sd->getJ();
            Mat3x3d Ia      = sd->getI();
            if (sd->isLinear()) {
              int i = sd->linearAxis();
              int j = (i + 1) % 3;
              int k = (i + 2) % 3;
              KE += 0.5 * (angMom[j] * angMom[j] / Ia(j, j) +
                           angMom[k] * angMom[k] / Ia(k, k));
              DOF += 2;
            } else {
              KE += 0.5 * (angMom[0] * angMom[0] / Ia(0, 0) +
                           angMom[1] * angMom[1] / Ia(1, 1) +
                           angMom[2] * angMom[2] / Ia(2, 2));
              DOF += 3;
            }
          }

          L  = mass * cross(rPos, vel);
          I  = outProduct(rPos, rPos) * mass;
          r2 = rPos.lengthSquare();
          I(0, 0) += mass * r2;
          I(1, 1) += mass * r2;
          I(2, 2) += mass * r2;

          if (outputMask_[ACTIVITY]) {
            if (sd->isRigidBody()) {
              int atomBinNo;
              RigidBody* rb = static_cast<RigidBody*>(sd);
              std::vector<Atom*>::iterator ai;
              Atom* atom;
              for (atom = rb->beginAtom(ai); atom != NULL;
                   atom = rb->nextAtom(ai)) {
                typeIndex = -1;
                atomBinNo = getBin(atom->getPos());

                atype = static_cast<Atom*>(atom)->getAtomType();
                at = std::find(outputTypes_.begin(), outputTypes_.end(), atype);
                if (at != outputTypes_.end()) {
                  typeIndex = std::distance(outputTypes_.begin(), at);
                }

                if (atomBinNo >= 0 && atomBinNo < int(nBins_)) {
                  if (typeIndex != -1) binTypeCounts[atomBinNo][typeIndex]++;
                }
              }
            } else if (sd->isAtom()) {
              typeIndex = -1;
              atype     = static_cast<Atom*>(sd)->getAtomType();
              at = std::find(outputTypes_.begin(), outputTypes_.end(), atype);
              if (at != outputTypes_.end()) {
                typeIndex = std::distance(outputTypes_.begin(), at);
              }

              if (binNo >= 0 && binNo < int(nBins_)) {
                if (outputMask_[ACTIVITY] && typeIndex != -1)
                  binTypeCounts[binNo][typeIndex]++;
              }
            }
          }

          if (binNo >= 0 && binNo < int(nBins_)) {
            binCount[binNo]++;
            binMass[binNo] += mass;
            binP[binNo] += mass * vel;
            binKE[binNo] += KE;
            binI[binNo] += I;
            binL[binNo] += L;
            binDOF[binNo] += DOF;
          }
        }

        // Calculate the electric field (kcal/mol/e/Angstrom) for all atoms
        // in the box
        if (outputMask_[ELECTRICFIELD]) {
          int atomBinNo;
          if (sd->isRigidBody()) {
            RigidBody* rb = static_cast<RigidBody*>(sd);
            std::vector<Atom*>::iterator ai;
            Atom* atom;
            for (atom = rb->beginAtom(ai); atom != NULL;
                 atom = rb->nextAtom(ai)) {
              atomBinNo = getBin(atom->getPos());
              eField    = atom->getElectricField();

              if (atomBinNo >= 0 && atomBinNo < int(nBins_)) {
                binEFieldCount[atomBinNo]++;
                binEField[atomBinNo] += eField;
              }
            }
          } else {
            eField    = sd->getElectricField();
            atomBinNo = getBin(sd->getPos());

            if (atomBinNo >= 0 && atomBinNo < int(nBins_)) {
              binEFieldCount[atomBinNo]++;
              binEField[atomBinNo] += eField;
            }
          }
        }
      }

      // we need to subtract out degrees of freedom from constraints
      // belonging in this bin:
      if (outputSeleMan_.isSelected(mol)) {
        for (consPair = mol->beginConstraintPair(cpi); consPair != NULL;
             consPair = mol->nextConstraintPair(cpi)) {
          Vector3d posA = consPair->getConsElem1()->getPos();
          Vector3d posB = consPair->getConsElem2()->getPos();

          if (usePeriodicBoundaryConditions_) {
            currentSnap_->wrapVector(posA);
            currentSnap_->wrapVector(posB);
          }

          Vector3d coc = 0.5 * (posA + posB);
          int binCons  = getBin(coc);
          binDOF[binCons] -= 1;
        }
      }
    }

#ifdef IS_MPI
    for (unsigned int i = 0; i < nBins_; i++) {
      MPI_Allreduce(MPI_IN_PLACE, &binCount[i], 1, MPI_INT, MPI_SUM,
                    MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &binMass[i], 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, binP[i].getArrayPointer(), 3, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, binL[i].getArrayPointer(), 3, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, binI[i].getArrayPointer(), 9, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &binKE[i], 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &binDOF[i], 1, MPI_INT, MPI_SUM,
                    MPI_COMM_WORLD);

      if (outputMask_[ELECTRICFIELD]) {
        MPI_Allreduce(MPI_IN_PLACE, &binEFieldCount[i], 1, MPI_INT, MPI_SUM,
                      MPI_COMM_WORLD);
        MPI_Allreduce(MPI_IN_PLACE, binEField[i].getArrayPointer(), 3,
                      MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
      }
      if (outputMask_[ACTIVITY]) {
        MPI_Allreduce(MPI_IN_PLACE, &binTypeCounts[i][0], outputTypes_.size(),
                      MPI_INT, MPI_SUM, MPI_COMM_WORLD);
      }
    }
#endif

    Vector3d omega;
    RealType z, r, temp, binVolume, den(0.0), dz(0.0);
    std::vector<RealType> nden(outputTypes_.size(), 0.0);
    RealType boxVolume = currentSnap_->getVolume();
    RealType ePot(0.0);

    for (unsigned int i = 0; i < nBins_; i++) {
      if (usePeriodicBoundaryConditions_) {
        z = (((RealType)i + 0.5) / (RealType)nBins_) *
            hmat_(rnemdPrivilegedAxis_, rnemdPrivilegedAxis_);
        data_[Z].accumulator[i]->add(z);

        binVolume = boxVolume / nBins_;
        dz        = hmat_(rnemdPrivilegedAxis_, rnemdPrivilegedAxis_) /
             (RealType)nBins_;
      } else {
        r = (((RealType)i + 0.5) * binWidth_);
        data_[R].accumulator[i]->add(r);

        RealType rinner = (RealType)i * binWidth_;
        RealType router = (RealType)(i + 1) * binWidth_;
        binVolume =
            (4.0 * Constants::PI * (pow(router, 3) - pow(rinner, 3))) / 3.0;
      }

      // The calculations of the following properties are done regardless
      //   of whether or not the selected species are present in the bin
      if (outputMask_[ELECTRICFIELD] && binEFieldCount[i] > 0) {
        eField = binEField[i] / RealType(binEFieldCount[i]);
        data_[ELECTRICFIELD].accumulator[i]->add(eField);
      }

      if (outputMask_[ELECTROSTATICPOTENTIAL]) {
        if (usePeriodicBoundaryConditions_ && binEFieldCount[i] > 0) {
          ePot += eField[rnemdPrivilegedAxis_] * dz;
          data_[ELECTROSTATICPOTENTIAL].accumulator[i]->add(ePot);
        }
      }

      // For the following properties, zero should be added if the selected
      //   species is not present in the bin
      if (outputMask_[DENSITY]) {
        den = binMass[i] * Constants::densityConvert / binVolume;
        data_[DENSITY].accumulator[i]->add(den);
      }

      if (outputMask_[ACTIVITY]) {
        for (unsigned int j = 0; j < outputTypes_.size(); j++) {
          nden[j] = (binTypeCounts[i][j] / binVolume) *
                    Constants::concentrationConvert;
        }
        data_[ACTIVITY].accumulator[i]->add(nden);
      }

      if (binCount[i] > 0) {
        // The calculations of the following properties are meaningless if
        //   the selected species is not found in the bin
        if (outputMask_[VELOCITY]) {
          vel = binP[i] / binMass[i];
          data_[VELOCITY].accumulator[i]->add(vel);
        }

        if (outputMask_[ANGULARVELOCITY]) {
          omega = binI[i].inverse() * binL[i];
          data_[ANGULARVELOCITY].accumulator[i]->add(omega);
        }

        if (outputMask_[TEMPERATURE]) {
          if (binDOF[i] > 0) {
            temp = 2.0 * binKE[i] /
                   (binDOF[i] * Constants::kb * Constants::energyConvert);
            data_[TEMPERATURE].accumulator[i]->add(temp);
          } else {
            std::cerr << "No degrees of freedom in this bin?\n";
          }
        }
      }
    }

    hasData_ = true;
  }